

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ListLambdaBindData::Deserialize(Deserializer *deserializer,ScalarFunction *param_2)

{
  undefined1 uVar1;
  undefined1 uVar2;
  Deserializer *in_RDI;
  bool has_initial;
  bool has_index;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> lambda_expr;
  LogicalType return_type;
  unique_ptr<duckdb::ListLambdaBindData,_std::default_delete<duckdb::ListLambdaBindData>_>
  *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  field_id_t field_id;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this;
  char *in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb2;
  undefined1 in_stack_ffffffffffffffb3;
  undefined2 in_stack_ffffffffffffffb4;
  field_id_t in_stack_ffffffffffffffb6;
  Deserializer *in_stack_ffffffffffffffb8;
  bool *args_3;
  Deserializer *in_stack_ffffffffffffffc8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
  *in_stack_ffffffffffffffd0;
  LogicalType *in_stack_ffffffffffffffd8;
  
  this._M_head_impl = (FunctionData *)in_RDI;
  Deserializer::ReadProperty<duckdb::LogicalType>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb6,in_stack_ffffffffffffffa8);
  field_id = (field_id_t)((ulong)in_RDI >> 0x30);
  args_3 = (bool *)0x0;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0x7fb173);
  Deserializer::
  ReadPropertyWithExplicitDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (in_stack_ffffffffffffffc8,(field_id_t)((ulong)args_3 >> 0x30),
             (char *)in_stack_ffffffffffffffb8,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             CONCAT26(in_stack_ffffffffffffffb6,
                      CONCAT24(in_stack_ffffffffffffffb4,
                               CONCAT13(in_stack_ffffffffffffffb3,
                                        CONCAT12(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0
                                                )))));
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0x7fb19f);
  uVar1 = Deserializer::ReadProperty<bool>
                    ((Deserializer *)this._M_head_impl,field_id,
                     (char *)CONCAT17(in_stack_ffffffffffffff87,
                                      CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80))
                    );
  uVar2 = Deserializer::ReadProperty<bool>
                    ((Deserializer *)this._M_head_impl,field_id,
                     (char *)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff86,
                                                     in_stack_ffffffffffffff80)));
  make_uniq<duckdb::ListLambdaBindData,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,bool&,bool&>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,(bool *)in_stack_ffffffffffffffc8,
             args_3);
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<duckdb::ListLambdaBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffff80)),in_stack_ffffffffffffff78);
  unique_ptr<duckdb::ListLambdaBindData,_std::default_delete<duckdb::ListLambdaBindData>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ListLambdaBindData,_std::default_delete<duckdb::ListLambdaBindData>,_true>
               *)0x7fb224);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0x7fb22e);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffd0);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         this._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> ListLambdaBindData::Deserialize(Deserializer &deserializer, ScalarFunction &) {
	auto return_type = deserializer.ReadProperty<LogicalType>(100, "return_type");
	auto lambda_expr = deserializer.ReadPropertyWithExplicitDefault<unique_ptr<Expression>>(101, "lambda_expr",
	                                                                                        unique_ptr<Expression>());
	auto has_index = deserializer.ReadProperty<bool>(102, "has_index");
	auto has_initial = deserializer.ReadProperty<bool>(103, "has_initial");
	return make_uniq<ListLambdaBindData>(return_type, std::move(lambda_expr), has_index, has_initial);
}